

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O1

void __thiscall Refal2::CQualifierParser::addLeftParen(CQualifierParser *this)

{
  bool bVar1;
  string local_38;
  
  bVar1 = (this->builder).negative;
  if (bVar1 == true) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"unexpected left parenthesis in qualifier","");
    error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    (this->builder).negative = (bool)(bVar1 ^ 1);
    this->afterRightParen = false;
  }
  return;
}

Assistant:

void CQualifierParser::addLeftParen()
{
	if( builder.IsNegative() ) {
		error( "unexpected left parenthesis in qualifier" );
	} else {
		builder.AddNegative();
		afterRightParen = false;
	}
}